

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O0

void build_pkt(void *buf,int len,uint id)

{
  uint16_t uVar1;
  in_addr_t iVar2;
  byte *pbVar3;
  uint16_t in_DX;
  int in_ESI;
  undefined1 *in_RDI;
  udphdr *udp;
  ip *ip;
  ether_header *eth;
  
  memset(in_RDI,0,(long)in_ESI);
  in_RDI[6] = 1;
  in_RDI[7] = 2;
  in_RDI[8] = 3;
  in_RDI[9] = 4;
  in_RDI[10] = 5;
  in_RDI[0xb] = 6;
  *in_RDI = 0xff;
  in_RDI[1] = 0xff;
  in_RDI[2] = 0xff;
  in_RDI[3] = 0xff;
  in_RDI[4] = 0xff;
  in_RDI[5] = 0xff;
  uVar1 = htons(0x800);
  *(uint16_t *)(in_RDI + 0xc) = uVar1;
  pbVar3 = in_RDI + 0xe;
  *pbVar3 = *pbVar3 & 0xf | 0x40;
  *pbVar3 = *pbVar3 & 0xf0 | 5;
  *(undefined2 *)(in_RDI + 0x12) = 0;
  in_RDI[0xf] = 0;
  uVar1 = htons((short)in_ESI - 0xe);
  *(uint16_t *)(in_RDI + 0x10) = uVar1;
  *(undefined2 *)(in_RDI + 0x14) = 0;
  in_RDI[0x16] = 0x10;
  in_RDI[0x17] = 0x11;
  *(undefined2 *)(in_RDI + 0x18) = 0;
  iVar2 = inet_addr("10.0.0.2");
  *(in_addr_t *)(in_RDI + 0x1a) = iVar2;
  iVar2 = inet_addr("10.0.0.1");
  *(in_addr_t *)(in_RDI + 0x1e) = iVar2;
  uVar1 = htons((short)in_ESI - 0x22);
  *(uint16_t *)(in_RDI + 0x26) = uVar1;
  uVar1 = htons(60000);
  *(uint16_t *)(in_RDI + 0x24) = uVar1;
  uVar1 = htons(in_DX);
  *(uint16_t *)(in_RDI + 0x22) = uVar1;
  *(undefined2 *)(in_RDI + 0x28) = 0;
  return;
}

Assistant:

void build_pkt(void *buf, int len, unsigned int id)
{
	struct ether_header *eth;
	struct ip *ip;
	struct udphdr *udp;

	memset(buf, 0, len);

	eth = (struct ether_header *)buf;
	eth->ether_shost[0] = 0x01;
	eth->ether_shost[1] = 0x02;
	eth->ether_shost[2] = 0x03;
	eth->ether_shost[3] = 0x04;
	eth->ether_shost[4] = 0x05;
	eth->ether_shost[5] = 0x06;

	eth->ether_dhost[0] = 0xff;
	eth->ether_dhost[1] = 0xff;
	eth->ether_dhost[2] = 0xff;
	eth->ether_dhost[3] = 0xff;
	eth->ether_dhost[4] = 0xff;
	eth->ether_dhost[5] = 0xff;

	eth->ether_type = htons(ETHERTYPE_IP);

	ip = (struct ip*)(eth + 1);
	ip->ip_v	= IPVERSION;
	ip->ip_hl       = 5;
	ip->ip_id       = 0;
	ip->ip_tos      = 0;
	ip->ip_len      = htons(len - sizeof(*eth));
	ip->ip_off      = 0;
	ip->ip_ttl      = 16;
	ip->ip_p	= IPPROTO_UDP;
	ip->ip_sum      = 0;
	ip->ip_src.s_addr = inet_addr("10.0.0.2");
	ip->ip_dst.s_addr = inet_addr("10.0.0.1");


	udp = (struct udphdr*)(ip + 1);
	udp->uh_ulen    = htons(len - sizeof(*eth) - sizeof(*ip));
	udp->uh_dport   = htons(60000);
	udp->uh_sport   = htons(id);
	udp->uh_sum     = 0;
}